

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# j2c-test.cpp
# Opt level: O0

void usage(FILE *stream)

{
  FILE *stream_local;
  
  fprintf((FILE *)stream,
          "USAGE: %s [-h|-help] [-V]\n\n       %s [-r] [-v] <filename> [...]\n\n  -V           - Show version\n  -h           - Show help\n  -r           - Show raw data\n  -v           - Print extra detail\n\n  NOTES: o There is no option grouping, all options must be distinct arguments.\n         o All option arguments must be separated from the option by whitespace.\n\n"
          ,PROGRAM_NAME,PROGRAM_NAME);
  return;
}

Assistant:

void
usage(FILE* stream = stderr)
{
  fprintf(stream, "\
USAGE: %s [-h|-help] [-V]\n\
\n\
       %s [-r] [-v] <filename> [...]\n\
\n\
  -V           - Show version\n\
  -h           - Show help\n\
  -r           - Show raw data\n\
  -v           - Print extra detail\n\
\n\
  NOTES: o There is no option grouping, all options must be distinct arguments.\n\
         o All option arguments must be separated from the option by whitespace.\n\
\n", PROGRAM_NAME, PROGRAM_NAME);
}